

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O2

void array_container_offset
               (array_container_t *c,container_t **loc,container_t **hic,uint16_t offset)

{
  uint uVar1;
  array_container_t *paVar2;
  ulong uVar3;
  long lVar4;
  int size;
  ulong uVar5;
  uint size_00;
  
  if (c->cardinality == 0) {
    size_00 = 0;
  }
  else {
    uVar1 = binarySearch(c->array,c->cardinality,-offset);
    size_00 = (int)uVar1 >> 0x1f ^ uVar1;
    if ((int)uVar1 >> 0x1f != uVar1 && loc != (container_t **)0x0) {
      paVar2 = array_container_create_given_capacity(size_00);
      uVar3 = 0;
      uVar5 = 0;
      if (0 < (int)size_00) {
        uVar5 = (ulong)size_00;
      }
      for (; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        array_container_add(paVar2,c->array[uVar3] + offset);
      }
      *loc = paVar2;
    }
  }
  if ((hic != (container_t **)0x0) && (size = c->cardinality - size_00, size != 0)) {
    paVar2 = array_container_create_given_capacity(size);
    for (lVar4 = (long)(int)size_00; lVar4 < c->cardinality; lVar4 = lVar4 + 1) {
      array_container_add(paVar2,c->array[lVar4] + offset);
    }
    *hic = paVar2;
  }
  return;
}

Assistant:

void array_container_offset(const array_container_t *c, container_t **loc,
                            container_t **hic, uint16_t offset) {
    array_container_t *lo = NULL, *hi = NULL;
    int top, lo_cap, hi_cap;

    top = (1 << 16) - offset;

    lo_cap = count_less(c->array, c->cardinality, top);
    if (loc && lo_cap) {
        lo = array_container_create_given_capacity(lo_cap);
        for (int i = 0; i < lo_cap; ++i) {
            array_container_add(lo, c->array[i] + offset);
        }
        *loc = (container_t *)lo;
    }

    hi_cap = c->cardinality - lo_cap;
    if (hic && hi_cap) {
        hi = array_container_create_given_capacity(hi_cap);
        for (int i = lo_cap; i < c->cardinality; ++i) {
            array_container_add(hi, c->array[i] + offset);
        }
        *hic = (container_t *)hi;
    }
}